

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O0

JL_STATUS FreeUnmarshalledList(JlMarshallElement *Description,void *ListPtr,size_t ListCount)

{
  JL_DATA_TYPE JVar1;
  void **Structure;
  void **allocatedArrayPtr_1;
  char **stringPtr;
  void *itemPtr;
  size_t i;
  void **allocatedArrayPtr;
  void *array;
  JL_DATA_TYPE type;
  JL_STATUS jlStatus;
  size_t ListCount_local;
  void *ListPtr_local;
  JlMarshallElement *Description_local;
  
  JVar1 = Description->Type;
  allocatedArrayPtr = (void **)ListPtr;
  if (Description->ArrayFieldSize == 0) {
    allocatedArrayPtr = *ListPtr;
  }
  for (itemPtr = (void *)0x0; itemPtr < ListCount; itemPtr = (void *)((long)itemPtr + 1)) {
    Structure = (void **)((long)allocatedArrayPtr + Description->ArrayItemSize * (long)itemPtr);
    if ((JVar1 == JL_DATA_TYPE_STRING) && (*Structure != (void *)0x0)) {
      WjTestLib_Free(*Structure);
      *Structure = (void *)0x0;
    }
    if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
      FreeUnmarshalledDictionary
                (Description->ChildStructDescription,(ulong)Description->ChildStructDescriptionCount
                 ,Structure);
    }
  }
  if ((Description->ArrayFieldSize == 0) && (*ListPtr != 0)) {
    WjTestLib_Free(*ListPtr);
    *(undefined8 *)ListPtr = 0;
  }
  return JL_STATUS_SUCCESS;
}

Assistant:

static
JL_STATUS
    FreeUnmarshalledList
    (
        JlMarshallElement const*    Description,
        void*                       ListPtr,
        size_t                      ListCount
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;
    JL_DATA_TYPE type = Description->Type;
    void* array = NULL;

    if( 0 == Description->ArrayFieldSize )
    {
        // Then the array container was allocated, and ListPtr points to the array container.
        void** allocatedArrayPtr = ListPtr;
        array = *allocatedArrayPtr;
    }
    else
    {
        // Fixed array, so ListPtr is pointing to the start of the array in the struct
        array = ListPtr;
    }

    for( size_t i=0; i<ListCount; i++ )
    {
        void* itemPtr = ((uint8_t*)array) + ( Description->ArrayItemSize * i );
        if( JL_DATA_TYPE_STRING == type )
        {
            char** stringPtr = itemPtr;

            if( NULL != *stringPtr )
            {
                JlFree( *stringPtr );
                *stringPtr = NULL;
            }
        }
        if( JL_DATA_TYPE_DICTIONARY == type )
        {
            jlStatus = FreeUnmarshalledDictionary( Description->ChildStructDescription, Description->ChildStructDescriptionCount, itemPtr );
        }
    }

    if( 0 == Description->ArrayFieldSize )
    {
        // Deallocate the container
        void** allocatedArrayPtr = ListPtr;

        if( NULL != *allocatedArrayPtr )
        {
            JlFree( *allocatedArrayPtr );
            *allocatedArrayPtr = NULL;
        }
    }

    jlStatus = JL_STATUS_SUCCESS;

    return jlStatus;
}